

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

void Fra_ClausProcessClausesCut3(Clu_Man_t *p,Fra_Sml_t *pSimMan,Aig_Cut_t *pCut,int *pScores)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint **ppuVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  uint Matrix [32];
  uint *pSims [16];
  
  bVar2 = pCut->nFanins;
  if (0xe < (byte)(bVar2 - 2)) {
    __assert_fail("pCut->nFanins > 1 && pCut->nFanins < 17",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                  ,0x12a,
                  "void Fra_ClausProcessClausesCut3(Clu_Man_t *, Fra_Sml_t *, Aig_Cut_t *, int *)");
  }
  iVar3 = pSimMan->nWordsTotal;
  iVar1 = p->nSimWordsPref;
  uVar8 = iVar3 - iVar1;
  if ((uVar8 & 7) == 0) {
    for (uVar6 = 0; bVar2 != uVar6; uVar6 = uVar6 + 1) {
      pSims[uVar6] = (uint *)((long)&pSimMan[1].pAig +
                             (long)*(int *)((long)&pCut[1].pNext + uVar6 * 4) * (long)iVar3 * 4 +
                             (long)iVar1 * 4);
    }
    uVar6 = 0;
    memset(pScores,0,(long)(1 << (bVar2 & 0x1f)) << 2);
    if (pCut->nLeafMax == '\x04') {
      uVar11 = (ulong)(uint)((int)uVar8 >> 3);
      if ((int)uVar8 >> 3 < 1) {
        uVar11 = uVar6;
      }
      for (uVar6 = 0; uVar6 != uVar11; uVar6 = uVar6 + 1) {
        Matrix[0x1c] = 0;
        Matrix[0x1d] = 0;
        Matrix[0x1e] = 0;
        Matrix[0x1f] = 0;
        Matrix[0x18] = 0;
        Matrix[0x19] = 0;
        Matrix[0x1a] = 0;
        Matrix[0x1b] = 0;
        Matrix[0x14] = 0;
        Matrix[0x15] = 0;
        Matrix[0x16] = 0;
        Matrix[0x17] = 0;
        Matrix[0x10] = 0;
        Matrix[0x11] = 0;
        Matrix[0x12] = 0;
        Matrix[0x13] = 0;
        Matrix[0xc] = 0;
        Matrix[0xd] = 0;
        Matrix[0xe] = 0;
        Matrix[0xf] = 0;
        Matrix[8] = 0;
        Matrix[9] = 0;
        Matrix[10] = 0;
        Matrix[0xb] = 0;
        Matrix[4] = 0;
        Matrix[5] = 0;
        Matrix[6] = 0;
        Matrix[7] = 0;
        Matrix[0] = 0;
        Matrix[1] = 0;
        Matrix[2] = 0;
        Matrix[3] = 0;
        bVar2 = pCut->nFanins;
        if ((char)bVar2 < '\x01') {
          bVar2 = 0;
        }
        puVar4 = Matrix + 0x1f;
        for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
          ppuVar7 = pSims;
          for (lVar10 = 0; -lVar10 != (ulong)bVar2; lVar10 = lVar10 + -1) {
            puVar4[lVar10] = (*ppuVar7)[uVar5 | uVar6 * 8];
            ppuVar7 = ppuVar7 + 1;
          }
          puVar4 = puVar4 + -4;
        }
        transpose32a(Matrix);
        for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 1) {
          uVar8 = Matrix[lVar10];
          iVar3 = 8;
          while (bVar12 = iVar3 != 0, iVar3 = iVar3 + -1, bVar12) {
            pScores[uVar8 & 0xf] = pScores[uVar8 & 0xf] + 1;
            uVar8 = uVar8 >> 4;
          }
        }
      }
    }
    else {
      uVar11 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar11 = uVar6;
      }
      for (; uVar6 != uVar11; uVar6 = uVar6 + 1) {
        bVar2 = pCut->nFanins;
        iVar3 = 0;
        if ((char)bVar2 < '\x01') {
          bVar2 = 0;
        }
        for (; iVar3 != 0x20; iVar3 = iVar3 + 1) {
          uVar8 = 0;
          for (uVar5 = 0; bVar2 != uVar5; uVar5 = uVar5 + 1) {
            uVar9 = 1 << ((byte)uVar5 & 0x1f);
            if ((pSims[uVar5][uVar6] & 1 << ((byte)iVar3 & 0x1f)) == 0) {
              uVar9 = 0;
            }
            uVar8 = uVar8 | uVar9;
          }
          pScores[(int)uVar8] = pScores[(int)uVar8] + 1;
        }
      }
    }
    return;
  }
  __assert_fail("nWordsForSim % 8 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                ,299,
                "void Fra_ClausProcessClausesCut3(Clu_Man_t *, Fra_Sml_t *, Aig_Cut_t *, int *)");
}

Assistant:

void Fra_ClausProcessClausesCut3( Clu_Man_t * p, Fra_Sml_t * pSimMan, Aig_Cut_t * pCut, int * pScores )
{
    unsigned Matrix[32];
    unsigned * pSims[16], uWord;
    int iMint, i, j, k, b, nMints, nSeries;
    int nWordsForSim = pSimMan->nWordsTotal - p->nSimWordsPref;

    // compute parameters
    assert( pCut->nFanins > 1 && pCut->nFanins < 17 );
    assert( nWordsForSim % 8 == 0 );
    // get parameters
    for ( i = 0; i < (int)pCut->nFanins; i++ )
        pSims[i] = Fra_ObjSim( pSimMan, pCut->pFanins[i] ) + p->nSimWordsPref;
    // add combinational patterns
    nMints = (1 << pCut->nFanins);
    memset( pScores, 0, sizeof(int) * nMints );

    if ( pCut->nLeafMax == 4 )
    {
        // convert the simulation patterns
        nSeries = nWordsForSim / 8;
        for ( i = 0; i < nSeries; i++ )
        {
            memset( Matrix, 0, sizeof(unsigned) * 32 );
            for ( k = 0; k < 8; k++ )
                for ( j = 0; j < (int)pCut->nFanins; j++ )
                    Matrix[31-(k*4+j)] = pSims[j][i*8+k];
            transpose32a( Matrix );
            for ( k = 0; k < 32; k++ )
                for ( j = 0, uWord = Matrix[k]; j < 8; j++, uWord >>= 4 )
                    pScores[uWord & 0xF]++;
        }
    }
    else
    {
        // go through the simulation patterns
        for ( i = 0; i < nWordsForSim; i++ )
            for ( k = 0; k < 32; k++ )
            {
                iMint = 0;
                for ( b = 0; b < (int)pCut->nFanins; b++ )
                    if ( pSims[b][i] & (1 << k) )
                        iMint |= (1 << b);
                pScores[iMint]++;
            }
    }
}